

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Face_Properties(FT_Face face,FT_UInt num_properties,FT_Parameter *properties)

{
  FT_Error local_24;
  FT_Parameter *pFStack_20;
  FT_Error error;
  FT_Parameter *properties_local;
  FT_UInt num_properties_local;
  FT_Face face_local;
  
  local_24 = 0;
  pFStack_20 = properties;
  properties_local._4_4_ = num_properties;
  if ((num_properties == 0) || (properties != (FT_Parameter *)0x0)) {
    for (; properties_local._4_4_ != 0; properties_local._4_4_ = properties_local._4_4_ - 1) {
      if (pFStack_20->tag == 0x6461726b) {
        if (pFStack_20->data == (FT_Pointer)0x0) {
          face->internal->no_stem_darkening = -1;
        }
        else if (*pFStack_20->data == '\x01') {
          face->internal->no_stem_darkening = '\0';
        }
        else {
          face->internal->no_stem_darkening = '\x01';
        }
      }
      else {
        if (pFStack_20->tag == 0x6c636466) {
          return 7;
        }
        if (pFStack_20->tag != 0x73656564) {
          return 6;
        }
        if (pFStack_20->data == (FT_Pointer)0x0) {
          face->internal->random_seed = -1;
        }
        else {
          face->internal->random_seed = *pFStack_20->data;
          if (face->internal->random_seed < 0) {
            face->internal->random_seed = 0;
          }
        }
      }
      pFStack_20 = pFStack_20 + 1;
    }
  }
  else {
    local_24 = 6;
  }
  return local_24;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Face_Properties( FT_Face        face,
                      FT_UInt        num_properties,
                      FT_Parameter*  properties )
  {
    FT_Error  error = FT_Err_Ok;


    if ( num_properties > 0 && !properties )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    for ( ; num_properties > 0; num_properties-- )
    {
      if ( properties->tag == FT_PARAM_TAG_STEM_DARKENING )
      {
        if ( properties->data )
        {
          if ( *( (FT_Bool*)properties->data ) == TRUE )
            face->internal->no_stem_darkening = FALSE;
          else
            face->internal->no_stem_darkening = TRUE;
        }
        else
        {
          /* use module default */
          face->internal->no_stem_darkening = -1;
        }
      }
      else if ( properties->tag == FT_PARAM_TAG_LCD_FILTER_WEIGHTS )
      {
#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
        if ( properties->data )
        {
          ft_memcpy( face->internal->lcd_weights,
                     properties->data,
                     FT_LCD_FILTER_FIVE_TAPS );
          face->internal->lcd_filter_func = ft_lcd_filter_fir;
        }
#else
        error = FT_THROW( Unimplemented_Feature );
        goto Exit;
#endif
      }
      else if ( properties->tag == FT_PARAM_TAG_RANDOM_SEED )
      {
        if ( properties->data )
        {
          face->internal->random_seed = *( (FT_Int32*)properties->data );
          if ( face->internal->random_seed < 0 )
            face->internal->random_seed = 0;
        }
        else
        {
          /* use module default */
          face->internal->random_seed = -1;
        }
      }
      else
      {
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }

      if ( error )
        break;

      properties++;
    }

  Exit:
    return error;
  }